

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForkNode.cpp
# Opt level: O1

bool __thiscall ForkNode::removeForkSuccessor(ForkNode *this,EntryNode *entryNode)

{
  size_t sVar1;
  EntryNode *pEVar2;
  set<ForkNode_*,_std::less<ForkNode_*>,_std::allocator<ForkNode_*>_> *this_00;
  bool bVar3;
  pair<std::_Rb_tree_iterator<EntryNode_*>,_std::_Rb_tree_iterator<EntryNode_*>_> pVar4;
  pair<std::_Rb_tree_iterator<ForkNode_*>,_std::_Rb_tree_iterator<ForkNode_*>_> pVar5;
  EntryNode *local_30;
  ForkNode *local_28;
  
  if (entryNode == (EntryNode *)0x0) {
    bVar3 = false;
  }
  else {
    local_30 = entryNode;
    pVar4 = std::
            _Rb_tree<EntryNode_*,_EntryNode_*,_std::_Identity<EntryNode_*>,_std::less<EntryNode_*>,_std::allocator<EntryNode_*>_>
            ::equal_range(&(this->forkSuccessors_)._M_t,&local_30);
    std::
    _Rb_tree<EntryNode_*,_EntryNode_*,_std::_Identity<EntryNode_*>,_std::less<EntryNode_*>,_std::allocator<EntryNode_*>_>
    ::_M_erase_aux(&(this->forkSuccessors_)._M_t,(_Base_ptr)pVar4.first._M_node,
                   (_Base_ptr)pVar4.second._M_node);
    pEVar2 = local_30;
    this_00 = &local_30->forkPredecessors_;
    local_28 = this;
    pVar5 = std::
            _Rb_tree<ForkNode_*,_ForkNode_*,_std::_Identity<ForkNode_*>,_std::less<ForkNode_*>,_std::allocator<ForkNode_*>_>
            ::equal_range(&this_00->_M_t,&local_28);
    sVar1 = (pEVar2->forkPredecessors_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    std::
    _Rb_tree<ForkNode_*,_ForkNode_*,_std::_Identity<ForkNode_*>,_std::less<ForkNode_*>,_std::allocator<ForkNode_*>_>
    ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar5.first._M_node,(_Base_ptr)pVar5.second._M_node);
    bVar3 = sVar1 != (pEVar2->forkPredecessors_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  }
  return bVar3;
}

Assistant:

bool ForkNode::removeForkSuccessor(EntryNode *entryNode) {
    if (!entryNode) {
        return false;
    }
    forkSuccessors_.erase(entryNode);
    return entryNode->forkPredecessors_.erase(this);
}